

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

void arg_parse_check(arg_hdr **table,arg_end *endtable)

{
  arg_checkfn *paVar1;
  void *parent;
  arg_hdr *paVar2;
  int error;
  
  do {
    paVar1 = (*table)->checkfn;
    if (paVar1 != (arg_checkfn *)0x0) {
      parent = (*table)->parent;
      error = (*paVar1)(parent);
      if (error != 0) {
        arg_register_error(endtable,parent,error,(char *)0x0);
      }
    }
    paVar2 = *table;
    table = table + 1;
  } while ((paVar2->flag & 1U) == 0);
  return;
}

Assistant:

static
void arg_parse_check(struct arg_hdr * *table, struct arg_end * endtable) {
	int tabindex = 0;

	/* printf("arg_parse_check()\n"); */
	do {
		if (table[tabindex]->checkfn) {
			void * parent  = table[tabindex]->parent;
			int errorcode = table[tabindex]->checkfn(parent);

			if (errorcode != 0) {
				arg_register_error(endtable, parent, errorcode, NULL);
			}
		}
	} while (!(table[tabindex++]->flag & ARG_TERMINATOR));
}